

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatclient.cpp
# Opt level: O0

void __thiscall ChatClient::jsonReceived(ChatClient *this,QJsonObject *docObj)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  QString local_260;
  QLatin1String local_248;
  QJsonValue local_238 [8];
  QJsonValue usernameVal_1;
  QLatin1String local_220;
  QString local_210;
  QString local_1f8;
  QLatin1String local_1e0;
  QJsonValue local_1d0 [8];
  QJsonValue usernameVal;
  QLatin1String local_1b8;
  QString local_1a8;
  QString local_190;
  QString local_178;
  QLatin1String local_160;
  QJsonValue local_150 [8];
  QJsonValue senderVal;
  QLatin1String local_138;
  QJsonValue local_128 [8];
  QJsonValue textVal;
  QLatin1String local_110;
  QString local_100;
  QString local_e8;
  QLatin1String local_d0;
  QJsonValue local_c0 [8];
  QJsonValue reasonVal;
  undefined1 auStack_a0 [7];
  bool loginSuccess;
  QJsonValue local_90 [8];
  QJsonValue resultVal;
  QLatin1String local_78;
  QString local_68;
  int local_50;
  QLatin1String local_40;
  QJsonValue local_30 [8];
  QJsonValue typeVal;
  QJsonObject *docObj_local;
  ChatClient *this_local;
  
  QLatin1String::QLatin1String(&local_40,"type");
  QJsonObject::value((QLatin1String *)local_30);
  bVar1 = QJsonValue::isNull(local_30);
  if ((bVar1) || (bVar1 = QJsonValue::isString(local_30), !bVar1)) {
    local_50 = 1;
    goto LAB_0010f073;
  }
  QJsonValue::toString();
  QLatin1String::QLatin1String(&local_78,"login");
  iVar3 = QString::compare((QLatin1String *)&local_68,(CaseSensitivity)local_78.m_size);
  QString::~QString(&local_68);
  if (iVar3 == 0) {
    if ((this->m_loggedIn & 1U) != 0) {
      local_50 = 1;
      goto LAB_0010f073;
    }
    QLatin1String::QLatin1String((QLatin1String *)auStack_a0,"success");
    QJsonObject::value((QLatin1String *)local_90);
    bVar1 = QJsonValue::isNull(local_90);
    if ((bVar1) || (bVar1 = QJsonValue::isBool(local_90), !bVar1)) {
      local_50 = 1;
    }
    else {
      bVar2 = QJsonValue::toBool(SUB81(local_90,0));
      if ((bVar2 & 1) == 0) {
        QLatin1String::QLatin1String(&local_d0,"reason");
        QJsonObject::value((QLatin1String *)local_c0);
        QJsonValue::toString();
        loginError(this,&local_e8);
        QString::~QString(&local_e8);
        QJsonValue::~QJsonValue(local_c0);
        local_50 = 0;
      }
      else {
        loggedIn(this);
        local_50 = 1;
      }
    }
    QJsonValue::~QJsonValue(local_90);
joined_r0x0010f03a:
    if (local_50 != 0) goto LAB_0010f073;
  }
  else {
    QJsonValue::toString();
    QLatin1String::QLatin1String(&local_110,"message");
    iVar3 = QString::compare((QLatin1String *)&local_100,(CaseSensitivity)local_110.m_size);
    QString::~QString(&local_100);
    if (iVar3 == 0) {
      QLatin1String::QLatin1String(&local_138,"text");
      QJsonObject::value((QLatin1String *)local_128);
      QLatin1String::QLatin1String(&local_160,"sender");
      QJsonObject::value((QLatin1String *)local_150);
      bVar1 = QJsonValue::isNull(local_128);
      if ((bVar1) || (bVar1 = QJsonValue::isString(local_128), !bVar1)) {
        local_50 = 1;
      }
      else {
        bVar1 = QJsonValue::isNull(local_150);
        if ((bVar1) || (bVar1 = QJsonValue::isString(local_150), !bVar1)) {
          local_50 = 1;
        }
        else {
          QJsonValue::toString();
          QJsonValue::toString();
          messageReceived(this,&local_178,&local_190);
          QString::~QString(&local_190);
          QString::~QString(&local_178);
          local_50 = 0;
        }
      }
      QJsonValue::~QJsonValue(local_150);
      QJsonValue::~QJsonValue(local_128);
      goto joined_r0x0010f03a;
    }
    QJsonValue::toString();
    QLatin1String::QLatin1String(&local_1b8,"newuser");
    iVar3 = QString::compare((QLatin1String *)&local_1a8,(CaseSensitivity)local_1b8.m_size);
    QString::~QString(&local_1a8);
    if (iVar3 == 0) {
      QLatin1String::QLatin1String(&local_1e0,"username");
      QJsonObject::value((QLatin1String *)local_1d0);
      bVar1 = QJsonValue::isNull(local_1d0);
      if ((bVar1) || (bVar1 = QJsonValue::isString(local_1d0), !bVar1)) {
        local_50 = 1;
      }
      else {
        QJsonValue::toString();
        userJoined(this,&local_1f8);
        QString::~QString(&local_1f8);
        local_50 = 0;
      }
      QJsonValue::~QJsonValue(local_1d0);
      goto joined_r0x0010f03a;
    }
    QJsonValue::toString();
    QLatin1String::QLatin1String(&local_220,"userdisconnected");
    iVar3 = QString::compare((QLatin1String *)&local_210,(CaseSensitivity)local_220.m_size);
    QString::~QString(&local_210);
    if (iVar3 == 0) {
      QLatin1String::QLatin1String(&local_248,"username");
      QJsonObject::value((QLatin1String *)local_238);
      bVar1 = QJsonValue::isNull(local_238);
      if ((bVar1) || (bVar1 = QJsonValue::isString(local_238), !bVar1)) {
        local_50 = 1;
      }
      else {
        QJsonValue::toString();
        userLeft(this,&local_260);
        QString::~QString(&local_260);
        local_50 = 0;
      }
      QJsonValue::~QJsonValue(local_238);
      goto joined_r0x0010f03a;
    }
  }
  local_50 = 0;
LAB_0010f073:
  QJsonValue::~QJsonValue(local_30);
  return;
}

Assistant:

void ChatClient::jsonReceived(const QJsonObject &docObj)
{
    // actions depend on the type of message
    const QJsonValue typeVal = docObj.value(QLatin1String("type"));
    if (typeVal.isNull() || !typeVal.isString())
        return; // a message with no type was received so we just ignore it
    if (typeVal.toString().compare(QLatin1String("login"), Qt::CaseInsensitive) == 0) { //It's a login message
        if (m_loggedIn)
            return; // if we are already logged in we ignore
        // the success field will contain the result of our attempt to login
        const QJsonValue resultVal = docObj.value(QLatin1String("success"));
        if (resultVal.isNull() || !resultVal.isBool())
            return; // the message had no success field so we ignore
        const bool loginSuccess = resultVal.toBool();
        if (loginSuccess) {
            // we logged in succesfully and we notify it via the loggedIn signal
            emit loggedIn();
            return;
        }
        // the login attempt failed, we extract the reason of the failure from the JSON
        // and notify it via the loginError signal
        const QJsonValue reasonVal = docObj.value(QLatin1String("reason"));
        emit loginError(reasonVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("message"), Qt::CaseInsensitive) == 0) { //It's a chat message
        // we extract the text field containing the chat text
        const QJsonValue textVal = docObj.value(QLatin1String("text"));
        // we extract the sender field containing the username of the sender
        const QJsonValue senderVal = docObj.value(QLatin1String("sender"));
        if (textVal.isNull() || !textVal.isString())
            return; // the text field was invalid so we ignore
        if (senderVal.isNull() || !senderVal.isString())
            return; // the sender field was invalid so we ignore
        // we notify a new message was received via the messageReceived signal
        emit messageReceived(senderVal.toString(), textVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("newuser"), Qt::CaseInsensitive) == 0) { // A user joined the chat
        // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the new user via the userJoined signal
        emit userJoined(usernameVal.toString());
    } else if (typeVal.toString().compare(QLatin1String("userdisconnected"), Qt::CaseInsensitive) == 0) { // A user left the chat
         // we extract the username of the new user
        const QJsonValue usernameVal = docObj.value(QLatin1String("username"));
        if (usernameVal.isNull() || !usernameVal.isString())
            return; // the username was invalid so we ignore
        // we notify of the user disconnection the userLeft signal
        emit userLeft(usernameVal.toString());
    }
}